

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O1

SystemSubroutine * __thiscall
slang::ast::Compilation::getSystemMethod(Compilation *this,SymbolKind typeKind,string_view name)

{
  group_type_pointer pgVar1;
  group_type_pointer pgVar2;
  value_type_pointer ppVar3;
  ulong uVar4;
  uint uVar5;
  undefined1 auVar6 [16];
  ushort uVar7;
  uchar uVar8;
  uchar uVar9;
  uchar uVar10;
  uchar uVar11;
  bool bVar12;
  SystemSubroutine *pSVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  value_type_pointer unaff_RBP;
  value_type_pointer __u;
  ulong uVar18;
  undefined1 auVar19 [16];
  size_t seed;
  size_t local_50;
  tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind> local_48;
  
  local_48.
  super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>
  .super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>._M_head_impl.
  _M_str = name._M_str;
  local_48.
  super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>
  .super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>._M_head_impl.
  _M_len = name._M_len;
  local_50 = 0;
  local_48.
  super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>
  .super__Tuple_impl<1UL,_slang::ast::SymbolKind>.
  super__Head_base<1UL,_slang::ast::SymbolKind,_false>._M_head_impl =
       (_Head_base<1UL,_slang::ast::SymbolKind,_false>)
       (_Head_base<1UL,_slang::ast::SymbolKind,_false>)typeKind;
  slang::detail::hashing::
  HashValueImpl<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_1UL>
  ::apply(&local_50,&local_48);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = local_50;
  uVar18 = SUB168(ZEXT816(0x9e3779b97f4a7c15) * auVar6,8) ^
           SUB168(ZEXT816(0x9e3779b97f4a7c15) * auVar6,0);
  uVar16 = uVar18 >> ((byte)(this->methodMap).table_.
                            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>,_std::shared_ptr<slang::ast::SystemSubroutine>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>,_std::shared_ptr<slang::ast::SystemSubroutine>_>_>_>
                            .arrays.groups_size_index & 0x3f);
  lVar17 = (uVar18 & 0xff) * 4;
  uVar8 = (&UNK_004b638c)[lVar17];
  uVar9 = (&UNK_004b638d)[lVar17];
  uVar10 = (&UNK_004b638e)[lVar17];
  uVar11 = (&UNK_004b638f)[lVar17];
  uVar15 = 0;
  do {
    pgVar2 = (this->methodMap).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>,_std::shared_ptr<slang::ast::SystemSubroutine>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>,_std::shared_ptr<slang::ast::SystemSubroutine>_>_>_>
             .arrays.groups_;
    pgVar1 = pgVar2 + uVar16;
    auVar19[0] = -(pgVar1->m[0].n == uVar8);
    auVar19[1] = -(pgVar1->m[1].n == uVar9);
    auVar19[2] = -(pgVar1->m[2].n == uVar10);
    auVar19[3] = -(pgVar1->m[3].n == uVar11);
    auVar19[4] = -(pgVar1->m[4].n == uVar8);
    auVar19[5] = -(pgVar1->m[5].n == uVar9);
    auVar19[6] = -(pgVar1->m[6].n == uVar10);
    auVar19[7] = -(pgVar1->m[7].n == uVar11);
    auVar19[8] = -(pgVar1->m[8].n == uVar8);
    auVar19[9] = -(pgVar1->m[9].n == uVar9);
    auVar19[10] = -(pgVar1->m[10].n == uVar10);
    auVar19[0xb] = -(pgVar1->m[0xb].n == uVar11);
    auVar19[0xc] = -(pgVar1->m[0xc].n == uVar8);
    auVar19[0xd] = -(pgVar1->m[0xd].n == uVar9);
    auVar19[0xe] = -(pgVar1->m[0xe].n == uVar10);
    auVar19[0xf] = -(pgVar1->m[0xf].n == uVar11);
    uVar7 = (ushort)(SUB161(auVar19 >> 7,0) & 1) | (ushort)(SUB161(auVar19 >> 0xf,0) & 1) << 1 |
            (ushort)(SUB161(auVar19 >> 0x17,0) & 1) << 2 |
            (ushort)(SUB161(auVar19 >> 0x1f,0) & 1) << 3 |
            (ushort)(SUB161(auVar19 >> 0x27,0) & 1) << 4 |
            (ushort)(SUB161(auVar19 >> 0x2f,0) & 1) << 5 |
            (ushort)(SUB161(auVar19 >> 0x37,0) & 1) << 6 |
            (ushort)(SUB161(auVar19 >> 0x3f,0) & 1) << 7 |
            (ushort)(SUB161(auVar19 >> 0x47,0) & 1) << 8 |
            (ushort)(SUB161(auVar19 >> 0x4f,0) & 1) << 9 |
            (ushort)(SUB161(auVar19 >> 0x57,0) & 1) << 10 |
            (ushort)(SUB161(auVar19 >> 0x5f,0) & 1) << 0xb |
            (ushort)(SUB161(auVar19 >> 0x67,0) & 1) << 0xc |
            (ushort)(SUB161(auVar19 >> 0x6f,0) & 1) << 0xd |
            (ushort)(SUB161(auVar19 >> 0x77,0) & 1) << 0xe;
    if (uVar7 != 0) {
      uVar14 = (uint)uVar7;
      ppVar3 = (this->methodMap).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>,_std::shared_ptr<slang::ast::SystemSubroutine>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>,_std::shared_ptr<slang::ast::SystemSubroutine>_>_>_>
               .arrays.elements_;
      do {
        uVar5 = 0;
        if (uVar14 != 0) {
          for (; (uVar14 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
          }
        }
        __u = ppVar3 + uVar16 * 0xf + (ulong)uVar5;
        bVar12 = std::
                 __tuple_compare<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_0UL,_2UL>
                 ::__eq(&local_48,&__u->first);
        if (bVar12) goto LAB_001505e6;
        uVar14 = uVar14 - 1 & uVar14;
      } while (uVar14 != 0);
      __u = unaff_RBP;
      if (bVar12) goto LAB_001505e6;
    }
    if ((pgVar2[uVar16].m[0xf].n &
        (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
          is_not_overflowed(unsigned_long)::shift)[(uint)uVar18 & 7]) == 0) break;
    uVar4 = (this->methodMap).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>,_std::shared_ptr<slang::ast::SystemSubroutine>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>,_std::shared_ptr<slang::ast::SystemSubroutine>_>_>_>
            .arrays.groups_size_mask;
    lVar17 = uVar16 + uVar15;
    uVar15 = uVar15 + 1;
    uVar16 = lVar17 + 1U & uVar4;
  } while (uVar15 <= uVar4);
  __u = (value_type_pointer)0x0;
LAB_001505e6:
  if (__u == (value_type_pointer)0x0) {
    pSVar13 = (SystemSubroutine *)0x0;
  }
  else {
    pSVar13 = (__u->second).
              super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  return pSVar13;
}

Assistant:

const SystemSubroutine* Compilation::getSystemMethod(SymbolKind typeKind,
                                                     std::string_view name) const {
    auto it = methodMap.find(std::make_tuple(name, typeKind));
    if (it == methodMap.end())
        return nullptr;
    return it->second.get();
}